

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::javanano::ClassName_abi_cxx11_
          (string *__return_storage_ptr__,javanano *this,Params *params,EnumDescriptor *descriptor)

{
  Params *params_00;
  
  params_00 = *(Params **)((long)&(params->empty_).field_2 + 8);
  if (this[0xd9] == (javanano)0x1) {
    ToJavaName(__return_storage_ptr__,(Params *)this,(string *)(params->empty_)._M_dataplus._M_p,
               true,(Descriptor *)params_00,
               (FileDescriptor *)(params->empty_).field_2._M_allocated_capacity);
  }
  else if (params_00 == (Params *)0x0) {
    ClassName_abi_cxx11_
              (__return_storage_ptr__,this,(Params *)(params->empty_).field_2._M_allocated_capacity,
               (FileDescriptor *)descriptor);
  }
  else {
    ClassName_abi_cxx11_(__return_storage_ptr__,this,params_00,(Descriptor *)descriptor);
  }
  return __return_storage_ptr__;
}

Assistant:

string ClassName(const Params& params, const EnumDescriptor* descriptor) {
  const Descriptor* parent = descriptor->containing_type();
  // When using Java enum style, an enum's class name contains the enum name.
  // Use the standard ToJavaName translation.
  if (params.java_enum_style()) {
    return ToJavaName(params, descriptor->name(), true, parent,
                      descriptor->file());
  }
  // Otherwise the enum members are accessed from the enclosing class.
  if (parent != NULL) {
    return ClassName(params, parent);
  } else {
    return ClassName(params, descriptor->file());
  }
}